

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

RpcValue __thiscall
miniros::master::Master::unregisterSubscriber
          (Master *this,string *caller_id,string *topic,string *caller_api,Connection *connection)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  undefined8 in_RDI;
  string *in_R8;
  XmlRpcSource *in_R9;
  RpcValue RVar3;
  int ret;
  bool enabled;
  RequesterInfo requesterInfo;
  RpcValue *res;
  undefined8 in_stack_fffffffffffffd88;
  Level level;
  RequesterInfo *in_stack_fffffffffffffd90;
  RequesterInfo *in_stack_fffffffffffffd98;
  LogLocation *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  RequesterInfo *in_stack_fffffffffffffdb0;
  Level LVar4;
  XmlRpcValue *this_00;
  string *in_stack_fffffffffffffdb8;
  allocator<char> *rhs;
  string *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  MasterHandler *in_stack_fffffffffffffdd0;
  undefined1 local_1e1 [40];
  allocator<char> local_1b9;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [52];
  undefined4 local_124;
  int local_120;
  undefined1 local_11a;
  allocator<char> local_119;
  string local_118 [32];
  Error local_f8 [12];
  
  level = (Level)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  XmlRpc::XmlRpcValue::Array((int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  RequesterInfo::RequesterInfo(in_stack_fffffffffffffdb0);
  LVar4 = (Level)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  XmlRpc::XmlRpcSource::getfd(in_R9);
  local_f8[0] = RequesterInfo::assign
                          (in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->callerId,level);
  bVar1 = Error::operator_cast_to_bool(local_f8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((unregisterSubscriber::loc.initialized_ ^ 0xffU) & 1) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffdd0->uri,
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (allocator<char> *)in_stack_fffffffffffffdc0);
      console::initializeLogLocation
                ((LogLocation *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,LVar4);
      ::std::__cxx11::string::~string(local_118);
      ::std::allocator<char>::~allocator(&local_119);
    }
    if (unregisterSubscriber::loc.level_ != Warn) {
      console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffd90,level);
      console::checkLogLocationEnabled(in_stack_fffffffffffffda0);
    }
    LVar4 = unregisterSubscriber::loc.level_;
    local_11a = (unregisterSubscriber::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_11a) {
      in_stack_fffffffffffffdd0 = (MasterHandler *)unregisterSubscriber::loc.logger_;
      in_stack_fffffffffffffd90 = (RequesterInfo *)::std::__cxx11::string::c_str();
      level = Debug;
      console::print((FilterBase *)0x0,in_stack_fffffffffffffdd0,(Level)(ulong)LVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                     ,0x13e,
                     "Master::RpcValue miniros::master::Master::unregisterSubscriber(const std::string &, const std::string &, const std::string &, Connection *)"
                    );
    }
  }
  ::std::__cxx11::string::operator=((string *)&stack0xffffffffffffff38,in_R8);
  iVar2 = MasterHandler::unregisterSubscriber
                    (in_stack_fffffffffffffdd0,
                     (RequesterInfo *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     in_stack_fffffffffffffdc0);
  local_124 = 1;
  local_120 = iVar2;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffd90,level);
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)__rhs,(int *)in_stack_fffffffffffffdb8);
  rhs = &local_1b9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffdd0->uri,(char *)CONCAT44(iVar2,in_stack_fffffffffffffdc8),
             (allocator<char> *)__rhs);
  ::std::operator+(&in_stack_fffffffffffffd98->callerId,&in_stack_fffffffffffffd90->callerId);
  this_00 = (XmlRpcValue *)local_1e1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffdd0->uri,(char *)CONCAT44(iVar2,in_stack_fffffffffffffdc8),
             (allocator<char> *)__rhs);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffdc8),__rhs);
  ::std::operator+(&in_stack_fffffffffffffd98->callerId,&in_stack_fffffffffffffd90->callerId);
  XmlRpc::XmlRpcValue::XmlRpcValue(this_00,in_stack_fffffffffffffda8);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffd90,level);
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)in_stack_fffffffffffffdd0,
             (XmlRpcValue *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x529717);
  ::std::__cxx11::string::~string(local_158);
  ::std::__cxx11::string::~string(local_178);
  ::std::__cxx11::string::~string((string *)(local_1e1 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_1e1);
  ::std::__cxx11::string::~string(local_198);
  ::std::__cxx11::string::~string(local_1b8);
  ::std::allocator<char>::~allocator(&local_1b9);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffd90,level);
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)__rhs,(int *)rhs);
  RequesterInfo::~RequesterInfo(in_stack_fffffffffffffd90);
  RVar3._value.asDouble = extraout_RDX.asDouble;
  RVar3._0_8_ = in_RDI;
  return RVar3;
}

Assistant:

Master::RpcValue Master::unregisterSubscriber(
  const std::string& caller_id, const std::string& topic, const std::string& caller_api, Connection* connection)
{
  RpcValue res = RpcValue::Array(3);
  RequesterInfo requesterInfo;
  if (!requesterInfo.assign(caller_id, connection->getfd())) {
    MINIROS_WARN("Failed to read network address of caller %s", caller_id.c_str());
  }
  requesterInfo.callerApi = caller_api;

  int ret = m_handler.unregisterSubscriber(requesterInfo, topic);
  res[0] = 1;
  res[1] = std::string("unregistered ") + caller_id + std::string("as provder of ") + topic;
  res[2] = ret;
  return res;
}